

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator=(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *rhs)

{
  int **p;
  int *piVar1;
  undefined4 *puVar2;
  char cVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  pointer pnVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  pointer pnVar13;
  uint *puVar14;
  undefined8 *puVar15;
  pointer pnVar16;
  uint *puVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  undefined4 *puVar19;
  byte bVar20;
  cpp_dec_float<200U,_int,_void> local_1a0;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar20 = 0;
  if (this != rhs) {
    clear(this);
    (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(rhs->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar7 = (rhs->super_IdxSet).len;
    (this->super_IdxSet).len = iVar7;
    p = &(this->super_IdxSet).idx;
    spx_realloc<int*>(p,iVar7);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)((ulong)((long)(rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(rhs->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 7),true);
    if (rhs->setupStatus == true) {
      IdxSet::operator=(&this->super_IdxSet,&rhs->super_IdxSet);
      lVar8 = (long)(this->super_IdxSet).num;
      if (0 < lVar8) {
        lVar8 = lVar8 + 1;
        do {
          iVar7 = (*p)[lVar8 + -2];
          pnVar9 = (rhs->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar4 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar13 = pnVar9 + iVar7;
          pnVar16 = pnVar4 + iVar7;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar20 * -2 + 1) * 4);
            pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          pnVar4[iVar7].m_backend.exp = pnVar9[iVar7].m_backend.exp;
          pnVar4[iVar7].m_backend.neg = pnVar9[iVar7].m_backend.neg;
          iVar6 = pnVar9[iVar7].m_backend.prec_elem;
          pnVar4[iVar7].m_backend.fpclass = pnVar9[iVar7].m_backend.fpclass;
          pnVar4[iVar7].m_backend.prec_elem = iVar6;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
      }
    }
    else {
      (this->super_IdxSet).num = 0;
      pnVar9 = (rhs->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(rhs->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar9) >> 7))
      {
        lVar8 = 0x78;
        lVar11 = 0;
        do {
          puVar15 = (undefined8 *)((long)&(pnVar9->m_backend).data + lVar8);
          puVar14 = (uint *)(puVar15 + -0xf);
          puVar17 = local_a0;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar17 = *puVar14;
            puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
            puVar17 = puVar17 + (ulong)bVar20 * -2 + 1;
          }
          iVar7 = *(int *)(puVar15 + -1);
          cVar3 = *(char *)((long)puVar15 + -4);
          uVar5 = *puVar15;
          puVar14 = local_a0;
          pcVar18 = &local_1a0;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar18->data)._M_elems[0] = *puVar14;
            puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar18 + ((ulong)bVar20 * -2 + 1) * 4);
          }
          local_1a0.neg = (bool)cVar3;
          if ((cVar3 == '\x01') &&
             ((fpclass_type)uVar5 != cpp_dec_float_finite || local_1a0.data._M_elems[0] != 0)) {
            local_1a0.neg = false;
          }
          local_1a0.exp = iVar7;
          local_1a0._120_8_ = uVar5;
          getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_120,this);
          if (((local_1a0.fpclass != cpp_dec_float_NaN) && (local_120.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_1a0,&local_120), 0 < iVar7)) {
            puVar10 = (undefined8 *)
                      ((long)&(((rhs->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar8)
            ;
            puVar2 = (undefined4 *)
                     ((long)&(((this->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                     lVar8 + -0x78);
            puVar15 = puVar10 + -0xf;
            puVar19 = puVar2;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar19 = *(undefined4 *)puVar15;
              puVar15 = (undefined8 *)((long)puVar15 + (ulong)bVar20 * -8 + 4);
              puVar19 = puVar19 + (ulong)bVar20 * -2 + 1;
            }
            puVar2[0x1c] = *(undefined4 *)(puVar10 + -1);
            *(undefined1 *)(puVar2 + 0x1d) = *(undefined1 *)((long)puVar10 + -4);
            *(undefined8 *)(puVar2 + 0x1e) = *puVar10;
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)lVar11;
            piVar1 = &(this->super_IdxSet).num;
            *piVar1 = *piVar1 + 1;
          }
          lVar11 = lVar11 + 1;
          pnVar9 = (rhs->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x80;
        } while (lVar11 < (int)((ulong)((long)(rhs->
                                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).val.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pnVar9) >> 7));
      }
    }
    this->setupStatus = true;
  }
  return this;
}

Assistant:

SSVectorBase<R>& operator=(const SSVectorBase<R>& rhs)
   {
      assert(rhs.isConsistent());

      if(this != &rhs)
      {
         clear();
         _tolerances = rhs._tolerances;
         setMax(rhs.max());
         VectorBase<R>::reDim(rhs.dim());

         if(rhs.isSetup())
         {
            IdxSet::operator=(rhs);

            for(int i = size() - 1; i >= 0; --i)
            {
               int j = index(i);
               VectorBase<R>::val[j] = rhs.val[j];
            }
         }
         else
         {
            num = 0;

            for(int i = 0; i < rhs.dim(); ++i)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  VectorBase<R>::val[i] = rhs.val[i];
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;
      }

      assert(isConsistent());

      return *this;
   }